

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

void MeCab::anon_unknown_0::anon_unknown_3::writeLattice(Lattice *lattice,StringBuffer *os)

{
  int iVar1;
  undefined4 extraout_var;
  StringBuffer *this;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_00;
  long lVar2;
  
  iVar1 = (*lattice->_vptr_Lattice[2])();
  __buf = extraout_RDX;
  for (lVar2 = *(long *)(CONCAT44(extraout_var,iVar1) + 8); *(long *)(lVar2 + 8) != 0;
      lVar2 = *(long *)(lVar2 + 8)) {
    StringBuffer::write(os,(int)*(undefined8 *)(lVar2 + 0x30),
                        (void *)(ulong)*(ushort *)(lVar2 + 0x44),in_RCX);
    this = (StringBuffer *)StringBuffer::write(os,9,__buf_00,in_RCX);
    StringBuffer::write(this,(int)*(undefined8 *)(lVar2 + 0x38),__buf_01,in_RCX);
    StringBuffer::write(os,10,__buf_02,in_RCX);
    __buf = extraout_RDX_00;
  }
  StringBuffer::write(os,0x18135b,__buf,in_RCX);
  return;
}

Assistant:

void writeLattice(Lattice *lattice, StringBuffer *os) {
  for (const Node *node = lattice->bos_node()->next;
       node->next; node = node->next) {
    os->write(node->surface, node->length);
    *os << '\t' << node->feature;
    *os << '\n';
  }
  *os << "EOS\n";
}